

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O3

ostream * amrex::operator<<(ostream *os,Array<unsigned_int,_3> *a)

{
  ostream *poVar1;
  char local_1c [4];
  
  local_1c[0] = '(';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_1c,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1c[1] = 0x2c;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 1,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1c[2] = 0x2c;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 2,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1c[3] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 3,1);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, Array<T,AMREX_SPACEDIM> const& a)
    {
        os << AMREX_D_TERM( '(' << a[0] , <<
                            ',' << a[1] , <<
                            ',' << a[2])  << ')';
        return os;
    }